

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int finaltarget(Instruction *code,int i)

{
  int local_18;
  Instruction pc;
  int count;
  int i_local;
  Instruction *code_local;
  
  local_18 = 0;
  pc = i;
  while ((local_18 < 100 && ((code[(int)pc] & 0x7f) == 0x38))) {
    pc = ((code[(int)pc] >> 7) - 0xfffffe) + pc;
    local_18 = local_18 + 1;
  }
  return pc;
}

Assistant:

static int finaltarget (Instruction *code, int i) {
  int count;
  for (count = 0; count < 100; count++) {  /* avoid infinite loops */
    Instruction pc = code[i];
    if (GET_OPCODE(pc) != OP_JMP)
      break;
     else
       i += GETARG_sJ(pc) + 1;
  }
  return i;
}